

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFontAtlas::CalcCustomRectUV
          (ImFontAtlas *this,ImFontAtlasCustomRect *rect,ImVec2 *out_uv_min,ImVec2 *out_uv_max)

{
  bool bVar1;
  ImVec2 *in_RCX;
  ImVec2 *in_RDX;
  ImFontAtlasCustomRect *in_RSI;
  long in_RDI;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 *local_20;
  ImVec2 *local_18;
  ImFontAtlasCustomRect *local_10;
  
  bVar1 = false;
  if (0 < *(int *)(in_RDI + 0x28)) {
    bVar1 = 0 < *(int *)(in_RDI + 0x2c);
  }
  if (!bVar1) {
    __assert_fail("TexWidth > 0 && TexHeight > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0x744,
                  "void ImFontAtlas::CalcCustomRectUV(const ImFontAtlasCustomRect *, ImVec2 *, ImVec2 *) const"
                 );
  }
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar1 = ImFontAtlasCustomRect::IsPacked(in_RSI);
  if (!bVar1) {
    __assert_fail("rect->IsPacked()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0x745,
                  "void ImFontAtlas::CalcCustomRectUV(const ImFontAtlasCustomRect *, ImVec2 *, ImVec2 *) const"
                 );
  }
  ImVec2::ImVec2(&local_28,(float)local_10->X * *(float *)(in_RDI + 0x30),
                 (float)local_10->Y * *(float *)(in_RDI + 0x34));
  *local_18 = local_28;
  ImVec2::ImVec2(&local_30,
                 (float)((uint)local_10->X + (uint)local_10->Width) * *(float *)(in_RDI + 0x30),
                 (float)((uint)local_10->Y + (uint)local_10->Height) * *(float *)(in_RDI + 0x34));
  *local_20 = local_30;
  return;
}

Assistant:

void ImFontAtlas::CalcCustomRectUV(const ImFontAtlasCustomRect* rect, ImVec2* out_uv_min, ImVec2* out_uv_max) const
{
    IM_ASSERT(TexWidth > 0 && TexHeight > 0);   // Font atlas needs to be built before we can calculate UV coordinates
    IM_ASSERT(rect->IsPacked());                // Make sure the rectangle has been packed
    *out_uv_min = ImVec2((float)rect->X * TexUvScale.x, (float)rect->Y * TexUvScale.y);
    *out_uv_max = ImVec2((float)(rect->X + rect->Width) * TexUvScale.x, (float)(rect->Y + rect->Height) * TexUvScale.y);
}